

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::IsConstRegOpnd(Lowerer *this,RegOpnd *opnd)

{
  bool bVar1;
  bool local_34;
  bool local_33;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_30;
  ValueType *vt;
  StackSym *sym;
  RegOpnd *opnd_local;
  Lowerer *this_local;
  
  vt = (ValueType *)opnd->m_sym;
  sym = (StackSym *)opnd;
  opnd_local = (RegOpnd *)this;
  bVar1 = StackSym::IsIntConst((StackSym *)vt);
  if ((!bVar1) && (bVar1 = StackSym::IsFloatConst((StackSym *)vt), !bVar1)) {
    local_32.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType((Opnd *)sym);
    local_30 = &local_32;
    bVar1 = ValueType::IsUndefined((ValueType *)&local_30->field_0);
    local_33 = true;
    if (!bVar1) {
      bVar1 = ValueType::IsNull((ValueType *)&local_30->field_0);
      local_33 = true;
      if (!bVar1) {
        local_34 = false;
        if ((*(uint *)(vt + 0xc) >> 3 & 1) != 0) {
          local_34 = ValueType::IsBoolean((ValueType *)&local_30->field_0);
        }
        local_33 = local_34;
      }
    }
    return local_33;
  }
  return false;
}

Assistant:

bool Lowerer::IsConstRegOpnd(IR::RegOpnd *opnd) const
{
    StackSym *sym = opnd->m_sym;

    if (sym->IsIntConst() || sym->IsFloatConst())
    {
        return false;
    }

    const auto& vt = opnd->GetValueType();
    return vt.IsUndefined() || vt.IsNull() || (sym->m_isConst && vt.IsBoolean());
}